

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O3

size_t NormalizeFileName_UpperBkSlash(char *szNormName,char *szFileName,size_t cchMaxChars)

{
  long lVar1;
  size_t sVar2;
  char cVar3;
  size_t sVar4;
  
  cVar3 = *szFileName;
  if ((long)cchMaxChars < 1 || cVar3 == '\0') {
    sVar2 = 0;
  }
  else {
    sVar4 = 0;
    do {
      szNormName[sVar4] = AsciiToUpperTable_BkSlash[cVar3];
      sVar2 = sVar4 + 1;
      cVar3 = szFileName[sVar4 + 1];
      if (cVar3 == '\0') break;
      lVar1 = sVar4 + 1;
      sVar4 = sVar2;
    } while (szNormName + lVar1 < szNormName + cchMaxChars);
    szNormName = szNormName + sVar2;
  }
  *szNormName = '\0';
  return sVar2;
}

Assistant:

size_t NormalizeFileName(const unsigned char * NormTable, char * szNormName, const char * szFileName, size_t cchMaxChars)
{
    char * szNormNameEnd = szNormName + cchMaxChars;
    size_t i;

    // Normalize the file name: ToLower + BackSlashToSlash
    for(i = 0; szFileName[0] != 0 && szNormName < szNormNameEnd; i++)
        *szNormName++ = NormTable[*szFileName++];

    // Terminate the string
    szNormName[0] = 0;
    return i;
}